

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::findMSBCaseInstance::getInputValues
          (findMSBCaseInstance *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  int in_R9D;
  Random rnd;
  deRandom local_30;
  
  dVar2 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  deRandom_init(&local_30,dVar2 ^ 0x742ac4e);
  pSVar1 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&local_30,(pSVar1->varType).m_data.basic.type,
             *(DataType *)((long)&(pSVar1->varType).m_data + 4),(Precision)*values,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0x742ac4e);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		deUint32*				inValue		= (deUint32*)values[0];

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}